

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Insert(Parse *pParse,SrcList *pTabList,Select *pSelect,IdList *pColumn,int onError,
                  Upsert *pUpsert)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FKey *pFVar4;
  bool local_1af;
  bool local_1ae;
  bool local_1ad;
  u16 local_1ac;
  int local_19c;
  bool local_189;
  int local_184;
  int bUseSeek;
  int isReplace;
  char *pVTab;
  int iRegStore;
  int addr1_1;
  Expr *pIpk;
  int local_160;
  int addr1;
  int regCols;
  int nIdx;
  NameContext sNC;
  int addrL;
  int regTempRowid;
  int regRec;
  int rc;
  int addrTop;
  int regYield;
  int tmask;
  Trigger *pTrigger;
  int *piStack_f0;
  int isView;
  int *aRegIdx;
  int regData;
  int regRowid;
  int regIns;
  int regRowCount;
  int regAutoinc;
  int regFromSelect;
  ExprList *pList;
  u8 bIdListInOrder;
  u8 withoutRowid;
  u8 appendFlag;
  u8 useTempTable;
  int iDb;
  SelectDest dest;
  int local_98;
  int addrCont;
  int addrInsTop;
  int srcTab;
  int endOfLoop;
  int ipkColumn;
  int iIdxCur;
  int iDataCur;
  int nHidden;
  int nColumn;
  Index *pIdx;
  Vdbe *v;
  int j;
  int i;
  Table *pTab;
  sqlite3 *db;
  Upsert *pUpsert_local;
  IdList *pIStack_40;
  int onError_local;
  IdList *pColumn_local;
  Select *pSelect_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  iIdxCur = 0;
  ipkColumn = 0;
  endOfLoop = 0;
  srcTab = -1;
  addrCont = 0;
  local_98 = 0;
  dest.pOrderBy._4_4_ = 0;
  pList._3_1_ = '\0';
  pList._2_1_ = 0;
  _regAutoinc = (ExprList *)0x0;
  regRowCount = 0;
  regIns = 0;
  regRowid = 0;
  piStack_f0 = (int *)0x0;
  pTab = (Table *)pParse->db;
  db = (sqlite3 *)pUpsert;
  pUpsert_local._4_4_ = onError;
  pIStack_40 = pColumn;
  pColumn_local = (IdList *)pSelect;
  pSelect_local = (Select *)pTabList;
  pTabList_local = (SrcList *)pParse;
  if ((pParse->nErr == 0) && (((sqlite3 *)pTab)->mallocFailed == '\0')) {
    iDb = 0;
    if ((pSelect != (Select *)0x0) &&
       (((pSelect->selFlags & 0x200) != 0 && (pSelect->pPrior == (Select *)0x0)))) {
      _regAutoinc = pSelect->pEList;
      pSelect->pEList = (ExprList *)0x0;
      sqlite3SelectDelete((sqlite3 *)pTab,pSelect);
      pColumn_local = (IdList *)0x0;
    }
    _j = sqlite3SrcListLookup((Parse *)pTabList_local,(SrcList *)pSelect_local);
    if (_j != (Table *)0x0) {
      pList._4_4_ = sqlite3SchemaToIndex((sqlite3 *)pTab,_j->pSchema);
      iVar1 = sqlite3AuthCheck((Parse *)pTabList_local,0x12,_j->zName,(char *)0x0,
                               *(char **)(pTab->pFKey->aAction + (long)pList._4_4_ * 0x20 + -0x2d));
      if (iVar1 == 0) {
        pList._1_1_ = ((_j->tabFlags & 0x20) == 0 ^ 0xffU) & 1;
        _regYield = sqlite3TriggersExist((Parse *)pTabList_local,_j,0x78,(ExprList *)0x0,&addrTop);
        pTrigger._4_4_ = (uint)(_j->pSelect != (Select *)0x0);
        iVar1 = sqlite3ViewGetColumnNames((Parse *)pTabList_local,_j);
        if (((iVar1 == 0) &&
            (iVar1 = sqlite3IsReadOnly((Parse *)pTabList_local,_j,addrTop), iVar1 == 0)) &&
           (pIdx = (Index *)sqlite3GetVdbe((Parse *)pTabList_local), (Vdbe *)pIdx != (Vdbe *)0x0)) {
          if (*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0') {
            sqlite3VdbeCountChanges((Vdbe *)pIdx);
          }
          local_189 = pColumn_local != (IdList *)0x0 || _regYield != (Trigger *)0x0;
          sqlite3BeginWriteOperation((Parse *)pTabList_local,(uint)local_189,pList._4_4_);
          if ((pIStack_40 != (IdList *)0x0) ||
             (iVar1 = xferOptimization((Parse *)pTabList_local,_j,(Select *)pColumn_local,
                                       pUpsert_local._4_4_,pList._4_4_), iVar1 == 0)) {
            regIns = autoIncBegin((Parse *)pTabList_local,pList._4_4_,_j);
            iVar1 = pTabList_local->a[0].addrFillSub;
            regData = iVar1 + 1;
            pTabList_local->a[0].addrFillSub = _j->nCol + 1 + pTabList_local->a[0].addrFillSub;
            aRegIdx._4_4_ = regData;
            if (_j->nModuleArg != 0) {
              aRegIdx._4_4_ = iVar1 + 2;
              pTabList_local->a[0].addrFillSub = pTabList_local->a[0].addrFillSub + 1;
            }
            aRegIdx._0_4_ = aRegIdx._4_4_ + 1;
            pList._0_1_ = (_j->tabFlags & 0x80) == 0;
            if (pIStack_40 != (IdList *)0x0) {
              for (v._4_4_ = 0; v._4_4_ < pIStack_40->nId; v._4_4_ = v._4_4_ + 1) {
                pIStack_40->a[v._4_4_].idx = -1;
              }
              for (v._4_4_ = 0; v._4_4_ < pIStack_40->nId; v._4_4_ = v._4_4_ + 1) {
                for (v._0_4_ = 0; (int)v < _j->nCol; v._0_4_ = (int)v + 1) {
                  iVar1 = sqlite3StrICmp(pIStack_40->a[v._4_4_].zName,_j->aCol[(int)v].zName);
                  if (iVar1 == 0) {
                    pIStack_40->a[v._4_4_].idx = (int)v;
                    if (v._4_4_ != (int)v) {
                      pList._0_1_ = '\0';
                    }
                    if ((int)v == _j->iPKey) {
                      srcTab = v._4_4_;
                    }
                    break;
                  }
                }
                if (_j->nCol <= (int)v) {
                  iVar1 = sqlite3IsRowid(pIStack_40->a[v._4_4_].zName);
                  if ((iVar1 == 0) || (pList._1_1_ != 0)) {
                    sqlite3ErrorMsg((Parse *)pTabList_local,"table %S has no column named %s",
                                    pSelect_local,0,pIStack_40->a[v._4_4_].zName);
                    *(undefined1 *)((long)&pTabList_local->a[0].zName + 5) = 1;
                    goto LAB_0018478c;
                  }
                  srcTab = v._4_4_;
                  pList._0_1_ = '\0';
                }
              }
            }
            if (pColumn_local == (IdList *)0x0) {
              memset(&regCols,0,0x38);
              _regCols = (Parse *)pTabList_local;
              addrCont = -1;
              if (_regAutoinc == (ExprList *)0x0) {
                iDataCur = 0;
              }
              else {
                iDataCur = _regAutoinc->nExpr;
                iVar1 = sqlite3ResolveExprListNames((NameContext *)&regCols,_regAutoinc);
                if (iVar1 != 0) goto LAB_0018478c;
              }
            }
            else {
              iVar1 = pTabList_local->a[0].addrFillSub + 1;
              pTabList_local->a[0].addrFillSub = iVar1;
              iVar2 = sqlite3VdbeCurrentAddr((Vdbe *)pIdx);
              sqlite3VdbeAddOp3((Vdbe *)pIdx,0xd,iVar1,0,iVar2 + 1);
              sqlite3SelectDestInit((SelectDest *)&bIdListInOrder,0xd,iVar1);
              if ((char)pList == '\0') {
                local_19c = 0;
              }
              else {
                local_19c = (int)aRegIdx;
              }
              dest._0_4_ = local_19c;
              dest.iSDParm = (int)_j->nCol;
              iVar3 = sqlite3Select((Parse *)pTabList_local,(Select *)pColumn_local,
                                    (SelectDest *)&bIdListInOrder);
              regRowCount = dest._0_4_;
              if (((iVar3 != 0) || (*(char *)((long)&pTab->pVTable + 1) != '\0')) ||
                 (*(int *)&pTabList_local->a[0].pSelect != 0)) goto LAB_0018478c;
              sqlite3VdbeEndCoroutine((Vdbe *)pIdx,iVar1);
              sqlite3VdbeJumpHere((Vdbe *)pIdx,iVar2);
              iDataCur = *(int *)&pColumn_local->a->zName;
              if ((_regYield != (Trigger *)0x0) ||
                 (iVar1 = readsTable((Parse *)pTabList_local,pList._4_4_,_j), iVar1 != 0)) {
                pList._3_1_ = '\x01';
              }
              if (pList._3_1_ != '\0') {
                addrCont = *(int *)((long)&pTabList_local->a[0].pSelect + 4);
                *(int *)((long)&pTabList_local->a[0].pSelect + 4) = addrCont + 1;
                iVar1 = sqlite3GetTempReg((Parse *)pTabList_local);
                iVar2 = sqlite3GetTempReg((Parse *)pTabList_local);
                sqlite3VdbeAddOp2((Vdbe *)pIdx,0x71,addrCont,iDataCur);
                sNC.pWinSelect._4_4_ = sqlite3VdbeAddOp1((Vdbe *)pIdx,0xe,iDb);
                sqlite3VdbeAddOp3((Vdbe *)pIdx,0x5c,regRowCount,iDataCur,iVar1);
                sqlite3VdbeAddOp2((Vdbe *)pIdx,0x79,addrCont,iVar2);
                sqlite3VdbeAddOp3((Vdbe *)pIdx,0x7a,addrCont,iVar1,iVar2);
                sqlite3VdbeGoto((Vdbe *)pIdx,sNC.pWinSelect._4_4_);
                sqlite3VdbeJumpHere((Vdbe *)pIdx,sNC.pWinSelect._4_4_);
                sqlite3ReleaseTempReg((Parse *)pTabList_local,iVar1);
                sqlite3ReleaseTempReg((Parse *)pTabList_local,iVar2);
              }
            }
            if ((pIStack_40 == (IdList *)0x0) && (0 < iDataCur)) {
              srcTab = (int)_j->iPKey;
            }
            for (v._4_4_ = 0; v._4_4_ < _j->nCol; v._4_4_ = v._4_4_ + 1) {
              iIdxCur = (uint)((_j->aCol[v._4_4_].colFlags & 2) != 0) + iIdxCur;
            }
            if (((pIStack_40 == (IdList *)0x0) && (iDataCur != 0)) &&
               (iDataCur != _j->nCol - iIdxCur)) {
              sqlite3ErrorMsg((Parse *)pTabList_local,
                              "table %S has %d columns but %d values were supplied",pSelect_local,0,
                              (ulong)(uint)(_j->nCol - iIdxCur),(ulong)(uint)iDataCur);
              goto LAB_0018478c;
            }
            if ((pIStack_40 != (IdList *)0x0) && (iDataCur != pIStack_40->nId)) {
              sqlite3ErrorMsg((Parse *)pTabList_local,"%d values for %d columns",
                              (ulong)(uint)iDataCur,(ulong)(uint)pIStack_40->nId);
              goto LAB_0018478c;
            }
            if (((((ulong)pTab->pCheck & 0x80) != 0) &&
                (*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0')) &&
               (pTabList_local[1].a[0].pSelect == (Select *)0x0)) {
              regRowid = pTabList_local->a[0].addrFillSub + 1;
              pTabList_local->a[0].addrFillSub = regRowid;
              sqlite3VdbeAddOp2((Vdbe *)pIdx,0x46,0,regRowid);
            }
            if (pTrigger._4_4_ == 0) {
              addr1 = sqlite3OpenTableAndIndices
                                ((Parse *)pTabList_local,_j,0x6d,'\0',-1,(u8 *)0x0,&ipkColumn,
                                 &endOfLoop);
              piStack_f0 = (int *)sqlite3DbMallocRawNN((sqlite3 *)pTab,(long)(addr1 + 1) << 2);
              if (piStack_f0 == (int *)0x0) goto LAB_0018478c;
              v._4_4_ = 0;
              _nHidden = _j->pIndex;
              for (; v._4_4_ < addr1; v._4_4_ = v._4_4_ + 1) {
                iVar1 = pTabList_local->a[0].addrFillSub + 1;
                pTabList_local->a[0].addrFillSub = iVar1;
                piStack_f0[v._4_4_] = iVar1;
                pTabList_local->a[0].addrFillSub =
                     (uint)_nHidden->nColumn + pTabList_local->a[0].addrFillSub;
                _nHidden = _nHidden->pNext;
              }
            }
            if (db != (sqlite3 *)0x0) {
              if (_j->nModuleArg != 0) {
                sqlite3ErrorMsg((Parse *)pTabList_local,
                                "UPSERT not implemented for virtual table \"%s\"",_j->zName);
                goto LAB_0018478c;
              }
              *(int *)&pSelect_local->pOrderBy = ipkColumn;
              *(Select **)&db->nDb = pSelect_local;
              *(int *)&db->flags = (int)aRegIdx;
              *(int *)((long)&db->flags + 4) = ipkColumn;
              *(int *)&db->lastRowid = endOfLoop;
              if (db->pVfs != (sqlite3_vfs *)0x0) {
                sqlite3UpsertAnalyzeTarget
                          ((Parse *)pTabList_local,(SrcList *)pSelect_local,(Upsert *)db);
              }
            }
            if (pList._3_1_ == '\0') {
              if (pColumn_local != (IdList *)0x0) {
                dest.pOrderBy._4_4_ = sqlite3VdbeAddOp1((Vdbe *)pIdx,0xe,iDb);
                local_98 = dest.pOrderBy._4_4_;
              }
            }
            else {
              local_98 = sqlite3VdbeAddOp1((Vdbe *)pIdx,0x24,addrCont);
              dest.pOrderBy._4_4_ = sqlite3VdbeCurrentAddr((Vdbe *)pIdx);
            }
            iVar1 = sqlite3VdbeMakeLabel((Parse *)pTabList_local);
            if ((addrTop & 1U) != 0) {
              local_160 = sqlite3GetTempRange((Parse *)pTabList_local,_j->nCol + 1);
              if (srcTab < 0) {
                sqlite3VdbeAddOp2((Vdbe *)pIdx,0x46,-1,local_160);
              }
              else {
                if (pList._3_1_ == '\0') {
                  sqlite3ExprCode((Parse *)pTabList_local,_regAutoinc->a[srcTab].pExpr,local_160);
                }
                else {
                  sqlite3VdbeAddOp3((Vdbe *)pIdx,0x5a,addrCont,srcTab,local_160);
                }
                pIpk._4_4_ = sqlite3VdbeAddOp1((Vdbe *)pIdx,0x33,local_160);
                sqlite3VdbeAddOp2((Vdbe *)pIdx,0x46,-1,local_160);
                sqlite3VdbeJumpHere((Vdbe *)pIdx,pIpk._4_4_);
                sqlite3VdbeAddOp1((Vdbe *)pIdx,0xf,local_160);
              }
              v._0_4_ = 0;
              for (v._4_4_ = 0; v._4_4_ < _j->nCol; v._4_4_ = v._4_4_ + 1) {
                if (pIStack_40 != (IdList *)0x0) {
                  v._0_4_ = 0;
                  while (((int)v < pIStack_40->nId && (pIStack_40->a[(int)v].idx != v._4_4_))) {
                    v._0_4_ = (int)v + 1;
                  }
                }
                if (((pList._3_1_ == '\0') && (_regAutoinc == (ExprList *)0x0)) ||
                   ((pIStack_40 != (IdList *)0x0 && (pIStack_40->nId <= (int)v)))) {
                  sqlite3ExprCode((Parse *)pTabList_local,_j->aCol[v._4_4_].pDflt,
                                  local_160 + v._4_4_ + 1);
                }
                else if (pList._3_1_ == '\0') {
                  sqlite3ExprCodeAndCache
                            ((Parse *)pTabList_local,_regAutoinc->a[(int)v].pExpr,
                             local_160 + v._4_4_ + 1);
                }
                else {
                  sqlite3VdbeAddOp3((Vdbe *)pIdx,0x5a,addrCont,(int)v,local_160 + v._4_4_ + 1);
                }
                if (pIStack_40 == (IdList *)0x0) {
                  v._0_4_ = (int)v + 1;
                }
              }
              if (pTrigger._4_4_ == 0) {
                sqlite3TableAffinity((Vdbe *)pIdx,_j,local_160 + 1);
              }
              sqlite3CodeRowTrigger
                        ((Parse *)pTabList_local,_regYield,0x78,(ExprList *)0x0,1,_j,
                         (local_160 - _j->nCol) + -1,pUpsert_local._4_4_,iVar1);
              sqlite3ReleaseTempRange((Parse *)pTabList_local,local_160,_j->nCol + 1);
            }
            if (pTrigger._4_4_ == 0) {
              if (_j->nModuleArg != 0) {
                sqlite3VdbeAddOp2((Vdbe *)pIdx,0x49,0,regData);
              }
              if (srcTab < 0) {
                if ((_j->nModuleArg == 0) && (pList._1_1_ == 0)) {
                  sqlite3VdbeAddOp3((Vdbe *)pIdx,0x79,ipkColumn,aRegIdx._4_4_,regIns);
                  pList._2_1_ = 1;
                }
                else {
                  sqlite3VdbeAddOp2((Vdbe *)pIdx,0x49,0,aRegIdx._4_4_);
                }
              }
              else {
                if (pList._3_1_ == '\0') {
                  if (pColumn_local == (IdList *)0x0) {
                    _iRegStore = _regAutoinc->a[srcTab].pExpr;
                    if ((_iRegStore->op == 'r') && (_j->nModuleArg == 0)) {
                      sqlite3VdbeAddOp3((Vdbe *)pIdx,0x79,ipkColumn,aRegIdx._4_4_,regIns);
                      pList._2_1_ = 1;
                    }
                    else {
                      sqlite3ExprCode((Parse *)pTabList_local,_regAutoinc->a[srcTab].pExpr,
                                      aRegIdx._4_4_);
                    }
                  }
                  else {
                    sqlite3VdbeAddOp2((Vdbe *)pIdx,0x4e,regRowCount + srcTab,aRegIdx._4_4_);
                  }
                }
                else {
                  sqlite3VdbeAddOp3((Vdbe *)pIdx,0x5a,addrCont,srcTab,aRegIdx._4_4_);
                }
                if (pList._2_1_ == 0) {
                  if (_j->nModuleArg == 0) {
                    pVTab._4_4_ = sqlite3VdbeAddOp1((Vdbe *)pIdx,0x33,aRegIdx._4_4_);
                    sqlite3VdbeAddOp3((Vdbe *)pIdx,0x79,ipkColumn,aRegIdx._4_4_,regIns);
                    sqlite3VdbeJumpHere((Vdbe *)pIdx,pVTab._4_4_);
                  }
                  else {
                    pVTab._4_4_ = sqlite3VdbeCurrentAddr((Vdbe *)pIdx);
                    sqlite3VdbeAddOp2((Vdbe *)pIdx,0x32,aRegIdx._4_4_,pVTab._4_4_ + 2);
                  }
                  sqlite3VdbeAddOp1((Vdbe *)pIdx,0xf,aRegIdx._4_4_);
                }
              }
              autoIncStep((Parse *)pTabList_local,regIns,aRegIdx._4_4_);
              iIdxCur = 0;
              for (v._4_4_ = 0; v._4_4_ < _j->nCol; v._4_4_ = v._4_4_ + 1) {
                pVTab._0_4_ = aRegIdx._4_4_ + 1 + v._4_4_;
                if (v._4_4_ == _j->iPKey) {
                  sqlite3VdbeAddOp1((Vdbe *)pIdx,0x4a,(int)pVTab);
                }
                else {
                  if (pIStack_40 == (IdList *)0x0) {
                    if ((_j->aCol[v._4_4_].colFlags & 2) == 0) {
                      v._0_4_ = v._4_4_ - iIdxCur;
                    }
                    else {
                      v._0_4_ = -1;
                      iIdxCur = iIdxCur + 1;
                    }
                  }
                  else {
                    v._0_4_ = 0;
                    while (((int)v < pIStack_40->nId && (pIStack_40->a[(int)v].idx != v._4_4_))) {
                      v._0_4_ = (int)v + 1;
                    }
                  }
                  if ((((int)v < 0) || (iDataCur == 0)) ||
                     ((pIStack_40 != (IdList *)0x0 && (pIStack_40->nId <= (int)v)))) {
                    sqlite3ExprCodeFactorable
                              ((Parse *)pTabList_local,_j->aCol[v._4_4_].pDflt,(int)pVTab);
                  }
                  else if (pList._3_1_ == '\0') {
                    if (pColumn_local == (IdList *)0x0) {
                      sqlite3ExprCode((Parse *)pTabList_local,_regAutoinc->a[(int)v].pExpr,
                                      (int)pVTab);
                    }
                    else if (regRowCount != (int)aRegIdx) {
                      sqlite3VdbeAddOp2((Vdbe *)pIdx,0x4f,regRowCount + (int)v,(int)pVTab);
                    }
                  }
                  else {
                    sqlite3VdbeAddOp3((Vdbe *)pIdx,0x5a,addrCont,(int)v,(int)pVTab);
                  }
                }
              }
              if (_j->nModuleArg == 0) {
                sqlite3GenerateConstraintChecks
                          ((Parse *)pTabList_local,_j,piStack_f0,ipkColumn,endOfLoop,regData,0,
                           -1 < srcTab,(u8)pUpsert_local._4_4_,iVar1,&local_184,(int *)0x0,
                           (Upsert *)db);
                sqlite3FkCheck((Parse *)pTabList_local,_j,0,regData,(int *)0x0,0);
                local_1ad = true;
                if (local_184 != 0) {
                  local_1ae = false;
                  if (_regYield == (Trigger *)0x0) {
                    local_1af = true;
                    if (((ulong)pTab->pCheck & 0x4000) != 0) {
                      pFVar4 = sqlite3FkReferences(_j);
                      local_1af = pFVar4 == (FKey *)0x0;
                    }
                    local_1ae = local_1af;
                  }
                  local_1ad = local_1ae;
                }
                sqlite3CompleteInsertion
                          ((Parse *)pTabList_local,_j,ipkColumn,endOfLoop,regData,piStack_f0,0,
                           (uint)pList._2_1_,(uint)local_1ad);
              }
              else {
                _bUseSeek = sqlite3GetVTable((sqlite3 *)pTab,_j);
                sqlite3VtabMakeWritable((Parse *)pTabList_local,_j);
                sqlite3VdbeAddOp4((Vdbe *)pIdx,10,1,_j->nCol + 2,regData,(char *)_bUseSeek,-0xc);
                if (pUpsert_local._4_4_ == 0xb) {
                  local_1ac = 2;
                }
                else {
                  local_1ac = (u16)pUpsert_local._4_4_;
                }
                sqlite3VdbeChangeP5((Vdbe *)pIdx,local_1ac);
                sqlite3MayAbort((Parse *)pTabList_local);
              }
            }
            if (regRowid != 0) {
              sqlite3VdbeAddOp2((Vdbe *)pIdx,0x53,regRowid,1);
            }
            if (_regYield != (Trigger *)0x0) {
              sqlite3CodeRowTrigger
                        ((Parse *)pTabList_local,_regYield,0x78,(ExprList *)0x0,2,_j,
                         ((int)aRegIdx + -2) - (int)_j->nCol,pUpsert_local._4_4_,iVar1);
            }
            sqlite3VdbeResolveLabel((Vdbe *)pIdx,iVar1);
            if (pList._3_1_ == '\0') {
              if (pColumn_local != (IdList *)0x0) {
                sqlite3VdbeGoto((Vdbe *)pIdx,dest.pOrderBy._4_4_);
                sqlite3VdbeJumpHere((Vdbe *)pIdx,local_98);
              }
            }
            else {
              sqlite3VdbeAddOp2((Vdbe *)pIdx,5,addrCont,dest.pOrderBy._4_4_);
              sqlite3VdbeJumpHere((Vdbe *)pIdx,local_98);
              sqlite3VdbeAddOp1((Vdbe *)pIdx,0x75,addrCont);
            }
          }
          if ((*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0') &&
             (pTabList_local[1].a[0].pSelect == (Select *)0x0)) {
            sqlite3AutoincrementEnd((Parse *)pTabList_local);
          }
          if (regRowid != 0) {
            sqlite3VdbeAddOp2((Vdbe *)pIdx,0x51,regRowid,1);
            sqlite3VdbeSetNumCols((Vdbe *)pIdx,1);
            sqlite3VdbeSetColName((Vdbe *)pIdx,0,0,"rows inserted",(_func_void_void_ptr *)0x0);
          }
        }
      }
    }
  }
LAB_0018478c:
  sqlite3SrcListDelete((sqlite3 *)pTab,(SrcList *)pSelect_local);
  sqlite3ExprListDelete((sqlite3 *)pTab,_regAutoinc);
  sqlite3UpsertDelete((sqlite3 *)pTab,(Upsert *)db);
  sqlite3SelectDelete((sqlite3 *)pTab,(Select *)pColumn_local);
  sqlite3IdListDelete((sqlite3 *)pTab,pIStack_40);
  sqlite3DbFree((sqlite3 *)pTab,piStack_f0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Insert(
  Parse *pParse,        /* Parser context */
  SrcList *pTabList,    /* Name of table into which we are inserting */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  IdList *pColumn,      /* Column names corresponding to IDLIST. */
  int onError,          /* How to handle constraint errors */
  Upsert *pUpsert       /* ON CONFLICT clauses for upsert, or NULL */
){
  sqlite3 *db;          /* The main database structure */
  Table *pTab;          /* The table to insert into.  aka TABLE */
  int i, j;             /* Loop counters */
  Vdbe *v;              /* Generate code into this virtual machine */
  Index *pIdx;          /* For looping over indices of the table */
  int nColumn;          /* Number of columns in the data */
  int nHidden = 0;      /* Number of hidden columns if TABLE is virtual */
  int iDataCur = 0;     /* VDBE cursor that is the main data repository */
  int iIdxCur = 0;      /* First index cursor */
  int ipkColumn = -1;   /* Column that is the INTEGER PRIMARY KEY */
  int endOfLoop;        /* Label for the end of the insertion loop */
  int srcTab = 0;       /* Data comes from this temporary cursor if >=0 */
  int addrInsTop = 0;   /* Jump to label "D" */
  int addrCont = 0;     /* Top of insert loop. Label "C" in templates 3 and 4 */
  SelectDest dest;      /* Destination for SELECT on rhs of INSERT */
  int iDb;              /* Index of database holding TABLE */
  u8 useTempTable = 0;  /* Store SELECT results in intermediate table */
  u8 appendFlag = 0;    /* True if the insert is likely to be an append */
  u8 withoutRowid;      /* 0 for normal table.  1 for WITHOUT ROWID table */
  u8 bIdListInOrder;    /* True if IDLIST is in table order */
  ExprList *pList = 0;  /* List of VALUES() to be inserted  */

  /* Register allocations */
  int regFromSelect = 0;/* Base register for data coming from SELECT */
  int regAutoinc = 0;   /* Register holding the AUTOINCREMENT counter */
  int regRowCount = 0;  /* Memory cell used for the row counter */
  int regIns;           /* Block of regs holding rowid+data being inserted */
  int regRowid;         /* registers holding insert rowid */
  int regData;          /* register holding first column to insert */
  int *aRegIdx = 0;     /* One register allocated to each index */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                 /* True if attempting to insert into a view */
  Trigger *pTrigger;          /* List of triggers on pTab, if required */
  int tmask;                  /* Mask of trigger times */
#endif

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto insert_cleanup;
  }
  dest.iSDParm = 0;  /* Suppress a harmless compiler warning */

  /* If the Select object is really just a simple VALUES() list with a
  ** single row (the common case) then keep that one row of values
  ** and discard the other (unused) parts of the pSelect object
  */
  if( pSelect && (pSelect->selFlags & SF_Values)!=0 && pSelect->pPrior==0 ){
    pList = pSelect->pEList;
    pSelect->pEList = 0;
    sqlite3SelectDelete(db, pSelect);
    pSelect = 0;
  }

  /* Locate the table into which we will be inserting new information.
  */
  assert( pTabList->nSrc==1 );
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ){
    goto insert_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  if( sqlite3AuthCheck(pParse, SQLITE_INSERT, pTab->zName, 0,
                       db->aDb[iDb].zDbSName) ){
    goto insert_cleanup;
  }
  withoutRowid = !HasRowid(pTab);

  /* Figure out if we have any triggers and if the table being
  ** inserted into is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_INSERT, 0, &tmask);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define tmask 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif
  assert( (pTrigger && tmask) || (pTrigger==0 && tmask==0) );

  /* If pTab is really a view, make sure it has been initialized.
  ** ViewGetColumnNames() is a no-op if pTab is not a view.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto insert_cleanup;
  }

  /* Cannot insert into a read-only table.
  */
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto insert_cleanup;
  }

  /* Allocate a VDBE
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto insert_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, pSelect || pTrigger, iDb);

#ifndef SQLITE_OMIT_XFER_OPT
  /* If the statement is of the form
  **
  **       INSERT INTO <table1> SELECT * FROM <table2>;
  **
  ** Then special optimizations can be applied that make the transfer
  ** very fast and which reduce fragmentation of indices.
  **
  ** This is the 2nd template.
  */
  if( pColumn==0 && xferOptimization(pParse, pTab, pSelect, onError, iDb) ){
    assert( !pTrigger );
    assert( pList==0 );
    goto insert_end;
  }
#endif /* SQLITE_OMIT_XFER_OPT */

  /* If this is an AUTOINCREMENT table, look up the sequence number in the
  ** sqlite_sequence table and store it in memory cell regAutoinc.
  */
  regAutoinc = autoIncBegin(pParse, iDb, pTab);

  /* Allocate registers for holding the rowid of the new row,
  ** the content of the new row, and the assembled row record.
  */
  regRowid = regIns = pParse->nMem+1;
  pParse->nMem += pTab->nCol + 1;
  if( IsVirtual(pTab) ){
    regRowid++;
    pParse->nMem++;
  }
  regData = regRowid+1;

  /* If the INSERT statement included an IDLIST term, then make sure
  ** all elements of the IDLIST really are columns of the table and 
  ** remember the column indices.
  **
  ** If the table has an INTEGER PRIMARY KEY column and that column
  ** is named in the IDLIST, then record in the ipkColumn variable
  ** the index into IDLIST of the primary key column.  ipkColumn is
  ** the index of the primary key as it appears in IDLIST, not as
  ** is appears in the original table.  (The index of the INTEGER
  ** PRIMARY KEY in the original table is pTab->iPKey.)
  */
  bIdListInOrder = (pTab->tabFlags & TF_OOOHidden)==0;
  if( pColumn ){
    for(i=0; i<pColumn->nId; i++){
      pColumn->a[i].idx = -1;
    }
    for(i=0; i<pColumn->nId; i++){
      for(j=0; j<pTab->nCol; j++){
        if( sqlite3StrICmp(pColumn->a[i].zName, pTab->aCol[j].zName)==0 ){
          pColumn->a[i].idx = j;
          if( i!=j ) bIdListInOrder = 0;
          if( j==pTab->iPKey ){
            ipkColumn = i;  assert( !withoutRowid );
          }
          break;
        }
      }
      if( j>=pTab->nCol ){
        if( sqlite3IsRowid(pColumn->a[i].zName) && !withoutRowid ){
          ipkColumn = i;
          bIdListInOrder = 0;
        }else{
          sqlite3ErrorMsg(pParse, "table %S has no column named %s",
              pTabList, 0, pColumn->a[i].zName);
          pParse->checkSchema = 1;
          goto insert_cleanup;
        }
      }
    }
  }

  /* Figure out how many columns of data are supplied.  If the data
  ** is coming from a SELECT statement, then generate a co-routine that
  ** produces a single row of the SELECT on each invocation.  The
  ** co-routine is the common header to the 3rd and 4th templates.
  */
  if( pSelect ){
    /* Data is coming from a SELECT or from a multi-row VALUES clause.
    ** Generate a co-routine to run the SELECT. */
    int regYield;       /* Register holding co-routine entry-point */
    int addrTop;        /* Top of the co-routine */
    int rc;             /* Result code */

    regYield = ++pParse->nMem;
    addrTop = sqlite3VdbeCurrentAddr(v) + 1;
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
    sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
    dest.iSdst = bIdListInOrder ? regData : 0;
    dest.nSdst = pTab->nCol;
    rc = sqlite3Select(pParse, pSelect, &dest);
    regFromSelect = dest.iSdst;
    if( rc || db->mallocFailed || pParse->nErr ) goto insert_cleanup;
    sqlite3VdbeEndCoroutine(v, regYield);
    sqlite3VdbeJumpHere(v, addrTop - 1);                       /* label B: */
    assert( pSelect->pEList );
    nColumn = pSelect->pEList->nExpr;

    /* Set useTempTable to TRUE if the result of the SELECT statement
    ** should be written into a temporary table (template 4).  Set to
    ** FALSE if each output row of the SELECT can be written directly into
    ** the destination table (template 3).
    **
    ** A temp table must be used if the table being updated is also one
    ** of the tables being read by the SELECT statement.  Also use a 
    ** temp table in the case of row triggers.
    */
    if( pTrigger || readsTable(pParse, iDb, pTab) ){
      useTempTable = 1;
    }

    if( useTempTable ){
      /* Invoke the coroutine to extract information from the SELECT
      ** and add it to a transient table srcTab.  The code generated
      ** here is from the 4th template:
      **
      **      B: open temp table
      **      L: yield X, goto M at EOF
      **         insert row from R..R+n into temp table
      **         goto L
      **      M: ...
      */
      int regRec;          /* Register to hold packed record */
      int regTempRowid;    /* Register to hold temp table ROWID */
      int addrL;           /* Label "L" */

      srcTab = pParse->nTab++;
      regRec = sqlite3GetTempReg(pParse);
      regTempRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, srcTab, nColumn);
      addrL = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm); VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regFromSelect, nColumn, regRec);
      sqlite3VdbeAddOp2(v, OP_NewRowid, srcTab, regTempRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, srcTab, regRec, regTempRowid);
      sqlite3VdbeGoto(v, addrL);
      sqlite3VdbeJumpHere(v, addrL);
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempReg(pParse, regTempRowid);
    }
  }else{
    /* This is the case if the data for the INSERT is coming from a 
    ** single-row VALUES clause
    */
    NameContext sNC;
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    srcTab = -1;
    assert( useTempTable==0 );
    if( pList ){
      nColumn = pList->nExpr;
      if( sqlite3ResolveExprListNames(&sNC, pList) ){
        goto insert_cleanup;
      }
    }else{
      nColumn = 0;
    }
  }

  /* If there is no IDLIST term but the table has an integer primary
  ** key, the set the ipkColumn variable to the integer primary key 
  ** column index in the original table definition.
  */
  if( pColumn==0 && nColumn>0 ){
    ipkColumn = pTab->iPKey;
  }

  /* Make sure the number of columns in the source data matches the number
  ** of columns to be inserted into the table.
  */
  for(i=0; i<pTab->nCol; i++){
    nHidden += (IsHiddenColumn(&pTab->aCol[i]) ? 1 : 0);
  }
  if( pColumn==0 && nColumn && nColumn!=(pTab->nCol-nHidden) ){
    sqlite3ErrorMsg(pParse, 
       "table %S has %d columns but %d values were supplied",
       pTabList, 0, pTab->nCol-nHidden, nColumn);
    goto insert_cleanup;
  }
  if( pColumn!=0 && nColumn!=pColumn->nId ){
    sqlite3ErrorMsg(pParse, "%d values for %d columns", nColumn, pColumn->nId);
    goto insert_cleanup;
  }
    
  /* Initialize the count of rows to be inserted
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  /* If this is not a view, open the table and and all indices */
  if( !isView ){
    int nIdx;
    nIdx = sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, 0, -1, 0,
                                      &iDataCur, &iIdxCur);
    aRegIdx = sqlite3DbMallocRawNN(db, sizeof(int)*(nIdx+1));
    if( aRegIdx==0 ){
      goto insert_cleanup;
    }
    for(i=0, pIdx=pTab->pIndex; i<nIdx; pIdx=pIdx->pNext, i++){
      assert( pIdx );
      aRegIdx[i] = ++pParse->nMem;
      pParse->nMem += pIdx->nColumn;
    }
  }
#ifndef SQLITE_OMIT_UPSERT
  if( pUpsert ){
    if( IsVirtual(pTab) ){
      sqlite3ErrorMsg(pParse, "UPSERT not implemented for virtual table \"%s\"",
              pTab->zName);
      goto insert_cleanup;
    }
    pTabList->a[0].iCursor = iDataCur;
    pUpsert->pUpsertSrc = pTabList;
    pUpsert->regData = regData;
    pUpsert->iDataCur = iDataCur;
    pUpsert->iIdxCur = iIdxCur;
    if( pUpsert->pUpsertTarget ){
      sqlite3UpsertAnalyzeTarget(pParse, pTabList, pUpsert);
    }
  }
#endif


  /* This is the top of the main insertion loop */
  if( useTempTable ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 4):
    **
    **         rewind temp table, if empty goto D
    **      C: loop over rows of intermediate table
    **           transfer values form intermediate table into <table>
    **         end loop
    **      D: ...
    */
    addrInsTop = sqlite3VdbeAddOp1(v, OP_Rewind, srcTab); VdbeCoverage(v);
    addrCont = sqlite3VdbeCurrentAddr(v);
  }else if( pSelect ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 3):
    **
    **      C: yield X, at EOF goto D
    **         insert the select result into <table> from R..R+n
    **         goto C
    **      D: ...
    */
    addrInsTop = addrCont = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
    VdbeCoverage(v);
  }

  /* Run the BEFORE and INSTEAD OF triggers, if there are any
  */
  endOfLoop = sqlite3VdbeMakeLabel(pParse);
  if( tmask & TRIGGER_BEFORE ){
    int regCols = sqlite3GetTempRange(pParse, pTab->nCol+1);

    /* build the NEW.* reference row.  Note that if there is an INTEGER
    ** PRIMARY KEY into which a NULL is being inserted, that NULL will be
    ** translated into a unique ID for the row.  But on a BEFORE trigger,
    ** we do not know what the unique ID will be (because the insert has
    ** not happened yet) so we substitute a rowid of -1
    */
    if( ipkColumn<0 ){
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
    }else{
      int addr1;
      assert( !withoutRowid );
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regCols);
      }else{
        assert( pSelect==0 );  /* Otherwise useTempTable is true */
        sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regCols);
      }
      addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regCols); VdbeCoverage(v);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, regCols); VdbeCoverage(v);
    }

    /* Cannot have triggers on a virtual table. If it were possible,
    ** this block would have to account for hidden column.
    */
    assert( !IsVirtual(pTab) );

    /* Create the new column data
    */
    for(i=j=0; i<pTab->nCol; i++){
      if( pColumn ){
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( (!useTempTable && !pList) || (pColumn && j>=pColumn->nId)
            || (pColumn==0 && IsOrdinaryHiddenColumn(&pTab->aCol[i])) ){
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regCols+i+1);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, regCols+i+1); 
      }else{
        assert( pSelect==0 ); /* Otherwise useTempTable is true */
        sqlite3ExprCodeAndCache(pParse, pList->a[j].pExpr, regCols+i+1);
      }
      if( pColumn==0 && !IsOrdinaryHiddenColumn(&pTab->aCol[i]) ) j++;
    }

    /* If this is an INSERT on a view with an INSTEAD OF INSERT trigger,
    ** do not attempt any conversions before assembling the record.
    ** If this is a real table, attempt conversions as required by the
    ** table column affinities.
    */
    if( !isView ){
      sqlite3TableAffinity(v, pTab, regCols+1);
    }

    /* Fire BEFORE or INSTEAD OF triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_BEFORE, 
        pTab, regCols-pTab->nCol-1, onError, endOfLoop);

    sqlite3ReleaseTempRange(pParse, regCols, pTab->nCol+1);
  }

  /* Compute the content of the next row to insert into a range of
  ** registers beginning at regIns.
  */
  if( !isView ){
    if( IsVirtual(pTab) ){
      /* The row that the VUpdate opcode will delete: none */
      sqlite3VdbeAddOp2(v, OP_Null, 0, regIns);
    }
    if( ipkColumn>=0 ){
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regRowid);
      }else if( pSelect ){
        sqlite3VdbeAddOp2(v, OP_Copy, regFromSelect+ipkColumn, regRowid);
      }else{
        Expr *pIpk = pList->a[ipkColumn].pExpr;
        if( pIpk->op==TK_NULL && !IsVirtual(pTab) ){
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          appendFlag = 1;
        }else{
          sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regRowid);
        }
      }
      /* If the PRIMARY KEY expression is NULL, then use OP_NewRowid
      ** to generate a unique primary key value.
      */
      if( !appendFlag ){
        int addr1;
        if( !IsVirtual(pTab) ){
          addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regRowid); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          sqlite3VdbeJumpHere(v, addr1);
        }else{
          addr1 = sqlite3VdbeCurrentAddr(v);
          sqlite3VdbeAddOp2(v, OP_IsNull, regRowid, addr1+2); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp1(v, OP_MustBeInt, regRowid); VdbeCoverage(v);
      }
    }else if( IsVirtual(pTab) || withoutRowid ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, regRowid);
    }else{
      sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
      appendFlag = 1;
    }
    autoIncStep(pParse, regAutoinc, regRowid);

    /* Compute data for all columns of the new entry, beginning
    ** with the first column.
    */
    nHidden = 0;
    for(i=0; i<pTab->nCol; i++){
      int iRegStore = regRowid+1+i;
      if( i==pTab->iPKey ){
        /* The value of the INTEGER PRIMARY KEY column is always a NULL.
        ** Whenever this column is read, the rowid will be substituted
        ** in its place.  Hence, fill this column with a NULL to avoid
        ** taking up data space with information that will never be used.
        ** As there may be shallow copies of this value, make it a soft-NULL */
        sqlite3VdbeAddOp1(v, OP_SoftNull, iRegStore);
        continue;
      }
      if( pColumn==0 ){
        if( IsHiddenColumn(&pTab->aCol[i]) ){
          j = -1;
          nHidden++;
        }else{
          j = i - nHidden;
        }
      }else{
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( j<0 || nColumn==0 || (pColumn && j>=pColumn->nId) ){
        sqlite3ExprCodeFactorable(pParse, pTab->aCol[i].pDflt, iRegStore);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, iRegStore); 
      }else if( pSelect ){
        if( regFromSelect!=regData ){
          sqlite3VdbeAddOp2(v, OP_SCopy, regFromSelect+j, iRegStore);
        }
      }else{
        sqlite3ExprCode(pParse, pList->a[j].pExpr, iRegStore);
      }
    }

    /* Generate code to check constraints and generate index keys and
    ** do the insertion.
    */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 1, pTab->nCol+2, regIns, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int isReplace;    /* Set to true if constraints may cause a replace */
      int bUseSeek;     /* True to use OPFLAG_SEEKRESULT */
      sqlite3GenerateConstraintChecks(pParse, pTab, aRegIdx, iDataCur, iIdxCur,
          regIns, 0, ipkColumn>=0, onError, endOfLoop, &isReplace, 0, pUpsert
      );
      sqlite3FkCheck(pParse, pTab, 0, regIns, 0, 0);

      /* Set the OPFLAG_USESEEKRESULT flag if either (a) there are no REPLACE
      ** constraints or (b) there are no triggers and this table is not a
      ** parent table in a foreign key constraint. It is safe to set the
      ** flag in the second case as if any REPLACE constraint is hit, an
      ** OP_Delete or OP_IdxDelete instruction will be executed on each 
      ** cursor that is disturbed. And these instructions both clear the
      ** VdbeCursor.seekResult variable, disabling the OPFLAG_USESEEKRESULT
      ** functionality.  */
      bUseSeek = (isReplace==0 || (pTrigger==0 &&
          ((db->flags & SQLITE_ForeignKeys)==0 || sqlite3FkReferences(pTab)==0)
      ));
      sqlite3CompleteInsertion(pParse, pTab, iDataCur, iIdxCur,
          regIns, aRegIdx, 0, appendFlag, bUseSeek
      );
    }
  }

  /* Update the count of rows that are inserted
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  if( pTrigger ){
    /* Code AFTER triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_AFTER, 
        pTab, regData-2-pTab->nCol, onError, endOfLoop);
  }

  /* The bottom of the main insertion loop, if the data source
  ** is a SELECT statement.
  */
  sqlite3VdbeResolveLabel(v, endOfLoop);
  if( useTempTable ){
    sqlite3VdbeAddOp2(v, OP_Next, srcTab, addrCont); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrInsTop);
    sqlite3VdbeAddOp1(v, OP_Close, srcTab);
  }else if( pSelect ){
    sqlite3VdbeGoto(v, addrCont);
    sqlite3VdbeJumpHere(v, addrInsTop);
  }

insert_end:
  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows inserted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows inserted", SQLITE_STATIC);
  }

insert_cleanup:
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pList);
  sqlite3UpsertDelete(db, pUpsert);
  sqlite3SelectDelete(db, pSelect);
  sqlite3IdListDelete(db, pColumn);
  sqlite3DbFree(db, aRegIdx);
}